

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

int * GetHashTable(BrotliEncoderStateInternal *s,int quality,size_t input_size,size_t *table_size)

{
  int *piVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = 0x20000;
  if (quality == 0) {
    sVar2 = 0x8000;
  }
  sVar2 = HashTableSize(sVar2,input_size);
  uVar3 = sVar2 << ((sVar2 & 0xaaaaa) == 0 && quality == 0);
  if (uVar3 < 0x401) {
    piVar1 = s->small_table_;
  }
  else if (s->large_table_size_ < uVar3) {
    s->large_table_size_ = uVar3;
    duckdb_brotli::BrotliFree(&s->memory_manager_,s->large_table_);
    s->large_table_ = (int *)0x0;
    piVar1 = (int *)duckdb_brotli::BrotliAllocate(&s->memory_manager_,uVar3 * 4);
    s->large_table_ = piVar1;
  }
  else {
    piVar1 = s->large_table_;
  }
  *table_size = uVar3;
  piVar1 = (int *)switchD_016d4fed::default(piVar1,0,uVar3 << 2);
  return piVar1;
}

Assistant:

static int* GetHashTable(BrotliEncoderState* s, int quality,
                         size_t input_size, size_t* table_size) {
  /* Use smaller hash table when input.size() is smaller, since we
     fill the table, incurring O(hash table size) overhead for
     compression, and if the input is short, we won't need that
     many hash table entries anyway. */
  MemoryManager* m = &s->memory_manager_;
  const size_t max_table_size = MaxHashTableSize(quality);
  size_t htsize = HashTableSize(max_table_size, input_size);
  int* table;
  BROTLI_DCHECK(max_table_size >= 256);
  if (quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
    /* Only odd shifts are supported by fast-one-pass. */
    if ((htsize & 0xAAAAA) == 0) {
      htsize <<= 1;
    }
  }

  if (htsize <= sizeof(s->small_table_) / sizeof(s->small_table_[0])) {
    table = s->small_table_;
  } else {
    if (htsize > s->large_table_size_) {
      s->large_table_size_ = htsize;
      BROTLI_FREE(m, s->large_table_);
      s->large_table_ = BROTLI_ALLOC(m, int, htsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->large_table_)) return 0;
    }
    table = s->large_table_;
  }

  *table_size = htsize;
  memset(table, 0, htsize * sizeof(*table));
  return table;
}